

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O1

wchar_t archive_acl_from_text_l
                  (archive_acl *acl,char *text,wchar_t want_type,archive_string_conv *sc)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  wchar_t wVar8;
  ulong uVar9;
  archive_acl_entry *paVar10;
  int *piVar11;
  byte *pbVar12;
  int iVar13;
  wchar_t wVar14;
  long lVar15;
  ulong uVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint uVar19;
  ulong uVar20;
  wchar_t wVar21;
  uint uVar22;
  wchar_t wVar23;
  bool bVar24;
  anon_struct_16_2_267fbce2 field [6];
  wchar_t local_f0;
  wchar_t local_ec;
  wchar_t local_e8;
  wchar_t local_e4;
  archive_acl *local_e0;
  byte *local_d8;
  wchar_t local_d0;
  uint local_cc;
  undefined8 local_c8;
  byte *local_c0;
  wchar_t local_b4;
  ulong local_b0;
  archive_string_conv *local_a8;
  long local_a0;
  long *local_98;
  long local_90;
  byte *local_88 [5];
  long alStack_60 [6];
  
  local_cc = 5;
  if (want_type < L'̀') {
    if ((want_type != L'Ā') && (want_type != L'Ȁ')) {
      return L'\xffffffe2';
    }
  }
  else if (want_type == L'㰀') {
    local_cc = 6;
  }
  else {
    if (want_type != L'̀') {
      return L'\xffffffe2';
    }
    want_type = L'Ā';
  }
  uVar20 = 0;
  wVar23 = L'\0';
  if (text == (char *)0x0) {
    local_e8 = L'\0';
  }
  else {
    local_e8 = L'\0';
    local_a8 = sc;
    if (*text != '\0') {
      uVar16 = (ulong)local_cc;
      local_a0 = uVar16 + 0xfffffffe;
      local_e8 = L'\0';
      local_e4 = want_type;
      local_e0 = acl;
LAB_003f85a5:
      uVar6 = 0;
      do {
        while ((uVar9 = uVar6, pbVar18 = (byte *)text, (ulong)(byte)*text < 0x21 &&
               ((0x100000600U >> ((ulong)(byte)*text & 0x3f) & 1) != 0))) {
          text = (char *)((byte *)text + 1);
          uVar6 = uVar9;
        }
        while( true ) {
          bVar1 = *pbVar18;
          if (((ulong)bVar1 < 0x3b) &&
             (pbVar12 = pbVar18, (0x400100000000401U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) break;
          pbVar18 = pbVar18 + 1;
        }
        do {
          pbVar17 = pbVar12;
          if (0x20 < (ulong)pbVar17[-1]) break;
          pbVar12 = pbVar17 + -1;
        } while ((0x100000600U >> ((ulong)pbVar17[-1] & 0x3f) & 1) != 0);
        bVar2 = *pbVar18;
        if (uVar9 < uVar16) {
          (&local_98)[uVar9 * 2] = (long *)text;
          (&local_90)[uVar9 * 2] = (long)pbVar17;
        }
        text = (char *)(pbVar18 + (bVar2 != 0));
        uVar6 = uVar9 + 1;
      } while (bVar1 == 0x3a);
      text = (char *)(pbVar18 + (bVar2 != 0));
      uVar22 = (uint)uVar9;
      local_b0 = uVar20;
      if ((uint)(uVar9 + 1) < local_cc) {
        memset(local_88 + uVar9 * 2,0,(ulong)((int)local_a0 - uVar22) * 0x10 + 0x10);
        want_type = local_e4;
      }
      if ((local_98 != (long *)0x0) && ((char)*local_98 == '#')) {
        uVar20 = local_b0 & 0xffffffff;
        goto LAB_003f8f07;
      }
      local_ec = L'\0';
      if (want_type != L'㰀') {
        local_c8 = 0;
        local_f0 = want_type;
        if (((char)*local_98 == 'd') &&
           ((uVar20 = local_90 - (long)local_98, uVar20 == 1 ||
            ((6 < uVar20 &&
             (*(short *)((long)local_98 + 5) == 0x746c && *(int *)((long)local_98 + 1) == 0x75616665
             )))))) {
          if (uVar20 < 8) {
            local_f0 = L'Ȁ';
            local_c8 = 1;
          }
          else {
            local_f0 = L'Ȁ';
            local_98 = (long *)((long)local_98 + 7);
          }
        }
        iVar13 = (int)local_c8;
        uVar20 = (ulong)((iVar13 + 1U) * 0x10);
        local_d8 = *(byte **)((long)&local_98 + uVar20);
        pbVar18 = *(byte **)((long)&local_90 + uVar20);
        if (local_d8 < pbVar18) {
          wVar23 = L'\0';
          pbVar12 = local_d8;
          do {
            bVar1 = *pbVar12;
            if ((byte)(bVar1 - 0x3a) < 0xf6) goto LAB_003f878e;
            wVar8 = L'\x7fffffff';
            if ((wVar23 < L'\x0ccccccd') && ((wVar23 != L'\x0ccccccc' || ((char)bVar1 < '8')))) {
              wVar8 = (uint)bVar1 + wVar23 * 10 + L'\xffffffd0';
            }
            wVar23 = wVar8;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar18);
        }
        else {
LAB_003f878e:
          wVar23 = L'\xffffffff';
        }
        local_d0 = wVar23;
        if ((wVar23 == L'\xffffffff') && (iVar13 + 3U <= uVar22)) {
          uVar20 = (ulong)((iVar13 + 3U) * 0x10);
          pbVar12 = *(byte **)((long)&local_98 + uVar20);
          pbVar17 = *(byte **)((long)&local_90 + uVar20);
          if (pbVar12 < pbVar17) {
            wVar8 = L'\0';
            do {
              bVar1 = *pbVar12;
              local_d0 = wVar23;
              if ((byte)(bVar1 - 0x3a) < 0xf6) break;
              wVar21 = L'\x7fffffff';
              if ((wVar8 < L'\x0ccccccd') && ((wVar8 != L'\x0ccccccc' || ((char)bVar1 < '8')))) {
                wVar21 = (uint)bVar1 + wVar8 * 10 + L'\xffffffd0';
              }
              wVar8 = wVar21;
              pbVar12 = pbVar12 + 1;
              local_d0 = wVar8;
            } while (pbVar12 != pbVar17);
          }
        }
        pcVar3 = *(char **)((long)&local_98 + (ulong)(uint)(iVar13 << 4));
        uVar19 = (int)*pcVar3 - 0x67U >> 1 | (uint)(((int)*pcVar3 - 0x67U & 1) != 0) << 0x1f;
        wVar8 = L'\0';
        wVar21 = L'\0';
        wVar23 = L'✓';
        if (uVar19 < 8) {
          lVar15 = *(long *)((long)&local_90 + (ulong)(uint)(iVar13 << 4)) - (long)pcVar3;
          wVar8 = L'\0';
          switch(uVar19) {
          case 0:
            if ((lVar15 == 1) ||
               ((wVar8 = wVar21, lVar15 == 5 && (*(int *)(pcVar3 + 1) == 0x70756f72)))) {
              wVar8 = L'✔';
            }
            break;
          case 3:
            if ((lVar15 == 1) ||
               ((wVar8 = wVar21, lVar15 == 4 &&
                (pcVar3[3] == 'k' && *(short *)(pcVar3 + 1) == 0x7361)))) {
              wVar8 = L'✕';
            }
            break;
          case 4:
            if ((lVar15 == 1) ||
               ((wVar8 = wVar21, lVar15 == 5 && (*(int *)(pcVar3 + 1) == 0x72656874)))) {
              wVar8 = L'✖';
            }
            break;
          case 7:
            if ((lVar15 == 1) ||
               ((wVar8 = wVar21, lVar15 == 4 &&
                (pcVar3[3] == 'r' && *(short *)(pcVar3 + 1) == 0x6573)))) {
              wVar23 = L'✑';
              wVar8 = L'✒';
            }
          }
        }
        if ((uint)(wVar8 + L'\xffffd8eb') < 2) {
          if ((iVar13 + 1U != uVar22 || pbVar18 <= local_d8) ||
             (local_c0 = pbVar18, wVar23 = ismode((char *)local_d8,(char *)pbVar18,&local_ec),
             pbVar18 = local_c0, want_type = local_e4, wVar23 == L'\0')) {
            iVar13 = (int)local_c8;
            if ((iVar13 + 2U != uVar22) || (pbVar18 <= local_d8)) goto LAB_003f8a81;
            goto LAB_003f8a71;
          }
          iVar7 = -1;
          pbVar18 = (byte *)0x0;
          local_d8 = (byte *)0x0;
          iVar13 = (int)local_c8;
          wVar23 = wVar8;
        }
        else {
          if ((wVar8 != L'✒') && (wVar8 != L'✔')) {
LAB_003f8a71:
            uVar20 = 0xffffffec;
            acl = local_e0;
            goto LAB_003f8f07;
          }
          iVar7 = 0;
          if ((pbVar18 <= local_d8) && (local_d0 == L'\xffffffff')) {
LAB_003f8a81:
            iVar7 = 0;
            local_d8 = (byte *)0x0;
            pbVar18 = (byte *)0x0;
            wVar23 = wVar8;
          }
        }
        local_c0 = pbVar18;
        if ((local_ec == L'\0') &&
           (uVar20 = (ulong)(iVar7 + iVar13 + 2),
           wVar8 = ismode((char *)(&local_98)[uVar20 * 2],(char *)(&local_90)[uVar20 * 2],&local_ec)
           , acl = local_e0, want_type = local_e4, wVar8 == L'\0')) goto LAB_003f8db1;
        goto LAB_003f8e1e;
      }
      bVar1 = 0;
      bVar24 = true;
      switch(local_90 - (long)local_98) {
      case 4:
        bVar1 = 0;
        bVar2 = 0;
        wVar23 = L'\0';
        if ((int)*local_98 == 0x72657375) {
          wVar23 = L'✑';
          bVar1 = 1;
          bVar24 = false;
          goto LAB_003f8ae4;
        }
        break;
      case 5:
        bVar1 = 0;
        bVar2 = 0;
        wVar23 = L'\0';
        if (*(char *)((long)local_98 + 4) == 'p' && (int)*local_98 == 0x756f7267) {
          wVar23 = L'✓';
          bVar2 = 1;
          bVar24 = false;
          bVar1 = 0;
        }
        break;
      case 6:
        bVar24 = false;
        if (*(short *)((long)local_98 + 4) == 0x4072 && (int)*local_98 == 0x656e776f) {
          wVar23 = L'✒';
          bVar1 = 0;
        }
        else {
          bVar4 = *(short *)((long)local_98 + 4) != 0x4070;
          bVar5 = (int)*local_98 != 0x756f7267;
          bVar24 = bVar4 || bVar5;
          wVar23 = L'✔';
          if (bVar4 || bVar5) {
            wVar23 = L'\0';
          }
          bVar1 = 0;
        }
        goto LAB_003f8ae4;
      default:
        bVar2 = 0;
        wVar23 = L'\0';
        break;
      case 9:
        bVar1 = 0;
        bVar4 = (char)local_98[1] != '@';
        bVar24 = bVar4 || *local_98 != 0x656e6f7972657665;
        wVar23 = L'❻';
        if (bVar4 || *local_98 != 0x656e6f7972657665) {
          wVar23 = L'\0';
        }
LAB_003f8ae4:
        bVar2 = 0;
      }
      uVar20 = 0xffffffec;
      if (!bVar24) {
        wVar21 = L'\xffffffff';
        wVar8 = wVar21;
        if ((bool)(bVar1 | bVar2)) {
          iVar13 = 1;
          local_d8 = local_88[0];
          pbVar18 = local_88[1];
          if (local_88[0] < local_88[1]) {
            wVar14 = L'\0';
            pbVar12 = local_88[0];
            do {
              bVar1 = *pbVar12;
              wVar8 = wVar21;
              if ((byte)(bVar1 - 0x3a) < 0xf6) break;
              wVar8 = L'\x7fffffff';
              if ((wVar14 < L'\x0ccccccd') && ((wVar14 != L'\x0ccccccc' || ((char)bVar1 < '8')))) {
                wVar8 = (uint)bVar1 + wVar14 * 10 + L'\xffffffd0';
              }
              wVar14 = wVar8;
              pbVar12 = pbVar12 + 1;
              wVar8 = wVar14;
            } while (pbVar12 != local_88[1]);
          }
        }
        else {
          local_d8 = (byte *)0x0;
          iVar13 = 0;
          pbVar18 = (byte *)0x0;
        }
        uVar20 = (ulong)(uint)(iVar13 << 4);
        pbVar12 = *(byte **)((long)local_88 + uVar20);
        pbVar17 = *(byte **)((long)local_88 + uVar20 + 8);
        local_d0 = wVar8;
        if (pbVar12 < pbVar17) {
          local_ec = L'\0';
          do {
            bVar1 = *pbVar12;
            if (bVar1 < 99) {
              if (bVar1 < 0x44) {
                if (bVar1 != 0x2d) {
                  if (bVar1 == 0x41) {
                    local_ec = local_ec | 0x400;
                  }
                  else {
                    if (bVar1 != 0x43) goto switchD_003f8bc8_caseD_71;
                    local_ec = local_ec | 0x2000;
                  }
                }
              }
              else if (bVar1 < 0x57) {
                if (bVar1 == 0x44) {
                  local_ec = local_ec | 0x100;
                }
                else {
                  if (bVar1 != 0x52) goto switchD_003f8bc8_caseD_71;
                  local_ec = local_ec | 0x40;
                }
              }
              else if (bVar1 == 0x57) {
                local_ec = local_ec | 0x80;
              }
              else {
                if (bVar1 != 0x61) goto switchD_003f8bc8_caseD_71;
                local_ec = local_ec | 0x200;
              }
            }
            else {
              switch(bVar1) {
              case 0x6f:
                local_ec = local_ec | 0x4000;
                break;
              case 0x70:
                local_ec = local_ec | 0x20;
                break;
              case 0x71:
              case 0x74:
              case 0x75:
              case 0x76:
                goto switchD_003f8bc8_caseD_71;
              case 0x72:
                local_ec = local_ec | 8;
                break;
              case 0x73:
                local_ec = local_ec | 0x8000;
                break;
              case 0x77:
                local_ec = local_ec | 0x10;
                break;
              case 0x78:
                local_ec = local_ec | 1;
                break;
              default:
                if (bVar1 == 99) {
                  local_ec = local_ec | 0x1000;
                }
                else {
                  if (bVar1 != 100) goto switchD_003f8bc8_caseD_71;
                  local_ec = local_ec | 0x800;
                }
              }
            }
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar17);
        }
        pbVar12 = *(byte **)((long)local_88 + uVar20 + 0x10);
        pbVar17 = *(byte **)((long)local_88 + uVar20 + 0x18);
        if (pbVar12 < pbVar17) {
          do {
            bVar1 = *pbVar12;
            if (bVar1 < 100) {
              if (bVar1 < 0x49) {
                if (bVar1 != 0x2d) {
                  if (bVar1 != 0x46) goto switchD_003f8bc8_caseD_71;
                  local_ec = local_ec | 0x40000000;
                }
              }
              else if (bVar1 == 0x49) {
                local_ec = local_ec | 0x1000000;
              }
              else {
                if (bVar1 != 0x53) goto switchD_003f8bc8_caseD_71;
                local_ec = local_ec | 0x20000000;
              }
            }
            else if (bVar1 < 0x69) {
              if (bVar1 == 100) {
                local_ec = local_ec | 0x4000000;
              }
              else {
                if (bVar1 != 0x66) goto switchD_003f8bc8_caseD_71;
                local_ec = local_ec | 0x2000000;
              }
            }
            else if (bVar1 == 0x69) {
              local_ec = local_ec | 0x10000000;
            }
            else {
              if (bVar1 != 0x6e) goto switchD_003f8bc8_caseD_71;
              local_ec = local_ec | 0x8000000;
            }
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar17);
        }
        piVar11 = *(int **)((long)local_88 + uVar20 + 0x20);
        lVar15 = *(long *)((long)alStack_60 + uVar20) - (long)piVar11;
        if (lVar15 == 5) {
          if ((char)piVar11[1] == 'w' && *piVar11 == 0x6f6c6c61) {
            local_f0 = L'Ѐ';
          }
          else {
            if ((char)piVar11[1] != 't' || *piVar11 != 0x69647561) {
              bVar4 = (char)piVar11[1] == 'm';
              bVar24 = !bVar4 || *piVar11 != 0x72616c61;
              local_f0 = (uint)(bVar4 && *piVar11 == 0x72616c61) << 0xd;
              goto LAB_003f8dad;
            }
            local_f0 = L'က';
          }
          bVar24 = false;
        }
        else {
          local_f0 = L'\0';
          if (lVar15 == 4) {
            bVar24 = *piVar11 != 0x796e6564;
            local_f0 = (uint)(*piVar11 == 0x796e6564) << 0xb;
          }
          else {
            bVar24 = true;
          }
        }
LAB_003f8dad:
        if (!bVar24) {
          pbVar12 = *(byte **)((long)alStack_60 + uVar20 + 8);
          pbVar17 = *(byte **)((long)alStack_60 + uVar20 + 0x10);
          local_c0 = pbVar18;
          if (pbVar12 < pbVar17) {
            wVar21 = L'\0';
            do {
              bVar1 = *pbVar12;
              local_d0 = wVar8;
              if ((byte)(bVar1 - 0x3a) < 0xf6) break;
              wVar14 = L'\x7fffffff';
              if ((wVar21 < L'\x0ccccccd') && ((wVar21 != L'\x0ccccccc' || ((char)bVar1 < '8')))) {
                wVar14 = (uint)bVar1 + wVar21 * 10 + L'\xffffffd0';
              }
              wVar21 = wVar14;
              pbVar12 = pbVar12 + 1;
              local_d0 = wVar21;
            } while (pbVar12 != pbVar17);
          }
LAB_003f8e1e:
          acl = local_e0;
          local_c8 = CONCAT44(local_c8._4_4_,local_ec);
          local_b4 = wVar23;
          wVar8 = acl_special(local_e0,local_f0,local_ec,wVar23);
          wVar23 = L'\0';
          if (wVar8 != L'\0') {
            paVar10 = acl_new_entry(acl,local_f0,(wchar_t)local_c8,local_b4,local_d0);
            if (paVar10 == (archive_acl_entry *)0x0) {
              wVar23 = L'\xffffffe7';
              acl = local_e0;
            }
            else if (((local_d8 == (byte *)0x0) || (local_c0 == local_d8)) || (*local_d8 == 0)) {
              archive_mstring_clean(&paVar10->name);
              wVar23 = L'\0';
              acl = local_e0;
            }
            else {
              wVar8 = archive_mstring_copy_mbs_len_l
                                (&paVar10->name,(char *)local_d8,(long)local_c0 - (long)local_d8,
                                 local_a8);
              acl = local_e0;
              wVar23 = L'\0';
              if (wVar8 != L'\0') {
                piVar11 = __errno_location();
                wVar23 = L'\xffffffec';
                if (*piVar11 == 0xc) {
                  wVar23 = L'\xffffffe2';
                }
              }
            }
          }
          if (wVar23 < L'\xffffffec') {
            return wVar23;
          }
          uVar22 = (uint)local_b0;
          if (wVar23 != L'\0') {
            uVar22 = 0xffffffec;
          }
          local_e8 = local_e8 | local_f0;
          uVar20 = (ulong)uVar22;
          want_type = local_e4;
          goto LAB_003f8f07;
        }
        goto LAB_003f8db1;
      }
      goto LAB_003f8f07;
    }
  }
LAB_003f8f1e:
  archive_acl_reset(acl,local_e8);
  return wVar23;
switchD_003f8bc8_caseD_71:
LAB_003f8db1:
  uVar20 = 0xffffffec;
LAB_003f8f07:
  wVar23 = (wchar_t)uVar20;
  if (*text == 0) goto LAB_003f8f1e;
  goto LAB_003f85a5;
}

Assistant:

int
archive_acl_from_text_l(struct archive_acl *acl, const char *text,
    int want_type, struct archive_string_conv *sc)
{
	struct {
		const char *start;
		const char *end;
	} field[6], name;

	const char *s, *st;
	int numfields, fields, n, r, sol, ret;
	int type, types, tag, permset, id;
	size_t len;
	char sep;

	switch (want_type) {
	case ARCHIVE_ENTRY_ACL_TYPE_POSIX1E:
		want_type = ARCHIVE_ENTRY_ACL_TYPE_ACCESS;
		__LA_FALLTHROUGH;
	case ARCHIVE_ENTRY_ACL_TYPE_ACCESS:
	case ARCHIVE_ENTRY_ACL_TYPE_DEFAULT:
		numfields = 5;
		break;
	case ARCHIVE_ENTRY_ACL_TYPE_NFS4:
		numfields = 6;
		break;
	default:
		return (ARCHIVE_FATAL);
	}

	ret = ARCHIVE_OK;
	types = 0;

	while (text != NULL  &&  *text != '\0') {
		/*
		 * Parse the fields out of the next entry,
		 * advance 'text' to start of next entry.
		 */
		fields = 0;
		do {
			const char *start, *end;
			next_field(&text, &start, &end, &sep);
			if (fields < numfields) {
				field[fields].start = start;
				field[fields].end = end;
			}
			++fields;
		} while (sep == ':');

		/* Set remaining fields to blank. */
		for (n = fields; n < numfields; ++n)
			field[n].start = field[n].end = NULL;

		if (field[0].start != NULL && *(field[0].start) == '#') {
			/* Comment, skip entry */
			continue;
		}

		n = 0;
		sol = 0;
		id = -1;
		permset = 0;
		name.start = name.end = NULL;

		if (want_type != ARCHIVE_ENTRY_ACL_TYPE_NFS4) {
			/* POSIX.1e ACLs */
			/*
			 * Default keyword "default:user::rwx"
			 * if found, we have one more field
			 *
			 * We also support old Solaris extension:
			 * "defaultuser::rwx" is the default ACL corresponding
			 * to "user::rwx", etc. valid only for first field
			 */
			s = field[0].start;
			len = field[0].end - field[0].start;
			if (*s == 'd' && (len == 1 || (len >= 7
			    && memcmp((s + 1), "efault", 6) == 0))) {
				type = ARCHIVE_ENTRY_ACL_TYPE_DEFAULT;
				if (len > 7)
					field[0].start += 7;
				else
					n = 1;
			} else
				type = want_type;

			/* Check for a numeric ID in field n+1 or n+3. */
			isint(field[n + 1].start, field[n + 1].end, &id);
			/* Field n+3 is optional. */
			if (id == -1 && fields > (n + 3))
				isint(field[n + 3].start, field[n + 3].end,
				    &id);

			tag = 0;
			s = field[n].start;
			st = field[n].start + 1;
			len = field[n].end - field[n].start;

			switch (*s) {
			case 'u':
				if (len == 1 || (len == 4
				    && memcmp(st, "ser", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				break;
			case 'g':
				if (len == 1 || (len == 5
				    && memcmp(st, "roup", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 'o':
				if (len == 1 || (len == 5
				    && memcmp(st, "ther", 4) == 0))
					tag = ARCHIVE_ENTRY_ACL_OTHER;
				break;
			case 'm':
				if (len == 1 || (len == 4
				    && memcmp(st, "ask", 3) == 0))
					tag = ARCHIVE_ENTRY_ACL_MASK;
				break;
			default:
					break;
			}

			switch (tag) {
			case ARCHIVE_ENTRY_ACL_OTHER:
			case ARCHIVE_ENTRY_ACL_MASK:
				if (fields == (n + 2)
				    && field[n + 1].start < field[n + 1].end
				    && ismode(field[n + 1].start,
				    field[n + 1].end, &permset)) {
					/* This is Solaris-style "other:rwx" */
					sol = 1;
				} else if (fields == (n + 3) &&
				    field[n + 1].start < field[n + 1].end) {
					/* Invalid mask or other field */
					ret = ARCHIVE_WARN;
					continue;
				}
				break;
			case ARCHIVE_ENTRY_ACL_USER_OBJ:
			case ARCHIVE_ENTRY_ACL_GROUP_OBJ:
				if (id != -1 ||
				    field[n + 1].start < field[n + 1].end) {
					name = field[n + 1];
					if (tag == ARCHIVE_ENTRY_ACL_USER_OBJ)
						tag = ARCHIVE_ENTRY_ACL_USER;
					else
						tag = ARCHIVE_ENTRY_ACL_GROUP;
				}
				break;
			default:
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}

			/*
			 * Without "default:" we expect mode in field 3
			 * Exception: Solaris other and mask fields
			 */
			if (permset == 0 && !ismode(field[n + 2 - sol].start,
			    field[n + 2 - sol].end, &permset)) {
				/* Invalid mode, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
		} else {
			/* NFS4 ACLs */
			s = field[0].start;
			len = field[0].end - field[0].start;
			tag = 0;

			switch (len) {
			case 4:
				if (memcmp(s, "user", 4) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER;
				break;
			case 5:
				if (memcmp(s, "group", 5) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP;
				break;
			case 6:
				if (memcmp(s, "owner@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_USER_OBJ;
				else if (memcmp(s, "group@", 6) == 0)
					tag = ARCHIVE_ENTRY_ACL_GROUP_OBJ;
				break;
			case 9:
				if (memcmp(s, "everyone@", 9) == 0)
					tag = ARCHIVE_ENTRY_ACL_EVERYONE;
				break;
			default:
				break;
			}

			if (tag == 0) {
				/* Invalid tag, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			} else if (tag == ARCHIVE_ENTRY_ACL_USER ||
			    tag == ARCHIVE_ENTRY_ACL_GROUP) {
				n = 1;
				name = field[1];
				isint(name.start, name.end, &id);
			} else
				n = 0;

			if (!is_nfs4_perms(field[1 + n].start,
			    field[1 + n].end, &permset)) {
				/* Invalid NFSv4 perms, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			if (!is_nfs4_flags(field[2 + n].start,
			    field[2 + n].end, &permset)) {
				/* Invalid NFSv4 flags, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			s = field[3 + n].start;
			len = field[3 + n].end - field[3 + n].start;
			type = 0;
			if (len == 4) {
				if (memcmp(s, "deny", 4) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_DENY;
			} else if (len == 5) {
				if (memcmp(s, "allow", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALLOW;
				else if (memcmp(s, "audit", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_AUDIT;
				else if (memcmp(s, "alarm", 5) == 0)
					type = ARCHIVE_ENTRY_ACL_TYPE_ALARM;
			}
			if (type == 0) {
				/* Invalid entry type, skip entry */
				ret = ARCHIVE_WARN;
				continue;
			}
			isint(field[4 + n].start, field[4 + n].end,
			    &id);
		}

		/* Add entry to the internal list. */
		r = archive_acl_add_entry_len_l(acl, type, permset,
		    tag, id, name.start, name.end - name.start, sc);
		if (r < ARCHIVE_WARN)
			return (r);
		if (r != ARCHIVE_OK)
			ret = ARCHIVE_WARN;
		types |= type;
	}

	/* Reset ACL */
	archive_acl_reset(acl, types);

	return (ret);
}